

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O1

void ARKStepPrintMem(void *arkode_mem,FILE *outfile)

{
  int iVar1;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeARKStepMem local_20;
  ARKodeMem local_18;
  
  iVar1 = arkStep_AccessStepMem(arkode_mem,"ARKStepPrintMem",&local_18,&local_20);
  if (iVar1 != 0) {
    return;
  }
  if (outfile == (FILE *)0x0) {
    outfile = (FILE *)_stdout;
  }
  arkPrintMem(local_18,outfile);
  fprintf((FILE *)outfile,"ARKStep: q = %i\n",(ulong)(uint)local_20->q);
  fprintf((FILE *)outfile,"ARKStep: p = %i\n",(ulong)(uint)local_20->p);
  fprintf((FILE *)outfile,"ARKStep: istage = %i\n",(ulong)(uint)local_20->istage);
  fprintf((FILE *)outfile,"ARKStep: stages = %i\n",(ulong)(uint)local_20->stages);
  fprintf((FILE *)outfile,"ARKStep: maxcor = %i\n",(ulong)(uint)local_20->maxcor);
  fprintf((FILE *)outfile,"ARKStep: msbp = %i\n",(ulong)(uint)local_20->msbp);
  fprintf((FILE *)outfile,"ARKStep: predictor = %i\n",(ulong)(uint)local_20->predictor);
  fprintf((FILE *)outfile,"ARKStep: lsolve_type = %i\n",(ulong)local_20->lsolve_type);
  fprintf((FILE *)outfile,"ARKStep: msolve_type = %i\n",(ulong)local_20->msolve_type);
  fprintf((FILE *)outfile,"ARKStep: convfail = %i\n",(ulong)(uint)local_20->convfail);
  fprintf((FILE *)outfile,"ARKStep: nfe = %li\n",local_20->nfe);
  fprintf((FILE *)outfile,"ARKStep: nfi = %li\n",local_20->nfi);
  fprintf((FILE *)outfile,"ARKStep: nsetups = %li\n",local_20->nsetups);
  fprintf((FILE *)outfile,"ARKStep: nstlp = %li\n",local_20->nstlp);
  fprintf((FILE *)outfile,"ARKStep: user_linear = %i\n",(ulong)(uint)local_20->linear);
  fprintf((FILE *)outfile,"ARKStep: user_linear_timedep = %i\n",
          (ulong)(uint)local_20->linear_timedep);
  fprintf((FILE *)outfile,"ARKStep: user_explicit = %i\n",(ulong)(uint)local_20->explicit);
  fprintf((FILE *)outfile,"ARKStep: user_implicit = %i\n",(ulong)(uint)local_20->implicit);
  fprintf((FILE *)outfile,"ARKStep: jcur = %i\n",(ulong)(uint)local_20->jcur);
  if (local_20->Be != (ARKodeButcherTable)0x0) {
    fwrite("ARKStep: explicit Butcher table:\n",0x21,1,(FILE *)outfile);
    ARKodeButcherTable_Write(local_20->Be,outfile);
  }
  if (local_20->Bi != (ARKodeButcherTable)0x0) {
    fwrite("ARKStep: implicit Butcher table:\n",0x21,1,(FILE *)outfile);
    ARKodeButcherTable_Write(local_20->Bi,outfile);
  }
  fprintf((FILE *)outfile,"ARKStep: gamma = %.16g\n",local_20->gamma);
  fprintf((FILE *)outfile,"ARKStep: gammap = %.16g\n",local_20->gammap);
  fprintf((FILE *)outfile,"ARKStep: gamrat = %.16g\n",local_20->gamrat);
  fprintf((FILE *)outfile,"ARKStep: crate = %.16g\n",local_20->crate);
  fprintf((FILE *)outfile,"ARKStep: eRNrm = %.16g\n",local_20->eRNrm);
  fprintf((FILE *)outfile,"ARKStep: nlscoef = %.16g\n",local_20->nlscoef);
  fprintf((FILE *)outfile,"ARKStep: crdown = %.16g\n",local_20->crdown);
  fprintf((FILE *)outfile,"ARKStep: rdiv = %.16g\n",local_20->rdiv);
  fprintf((FILE *)outfile,"ARKStep: dgmax = %.16g\n",local_20->dgmax);
  return;
}

Assistant:

void ARKStepPrintMem(void* arkode_mem, FILE* outfile)
{
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  int retval;

#ifdef SUNDIALS_DEBUG_PRINTVEC
  int i;
#endif

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(arkode_mem, "ARKStepPrintMem",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return;

  /* if outfile==NULL, set it to stdout */
  if (outfile == NULL)  outfile = stdout;

  /* output data from main ARKode infrastructure */
  arkPrintMem(ark_mem, outfile);

  /* output integer quantities */
  fprintf(outfile,"ARKStep: q = %i\n", step_mem->q);
  fprintf(outfile,"ARKStep: p = %i\n", step_mem->p);
  fprintf(outfile,"ARKStep: istage = %i\n", step_mem->istage);
  fprintf(outfile,"ARKStep: stages = %i\n", step_mem->stages);
  fprintf(outfile,"ARKStep: maxcor = %i\n", step_mem->maxcor);
  fprintf(outfile,"ARKStep: msbp = %i\n", step_mem->msbp);
  fprintf(outfile,"ARKStep: predictor = %i\n", step_mem->predictor);
  fprintf(outfile,"ARKStep: lsolve_type = %i\n", step_mem->lsolve_type);
  fprintf(outfile,"ARKStep: msolve_type = %i\n", step_mem->msolve_type);
  fprintf(outfile,"ARKStep: convfail = %i\n", step_mem->convfail);

  /* output long integer quantities */
  fprintf(outfile,"ARKStep: nfe = %li\n", step_mem->nfe);
  fprintf(outfile,"ARKStep: nfi = %li\n", step_mem->nfi);
  fprintf(outfile,"ARKStep: nsetups = %li\n", step_mem->nsetups);
  fprintf(outfile,"ARKStep: nstlp = %li\n", step_mem->nstlp);

  /* output boolean quantities */
  fprintf(outfile,"ARKStep: user_linear = %i\n", step_mem->linear);
  fprintf(outfile,"ARKStep: user_linear_timedep = %i\n", step_mem->linear_timedep);
  fprintf(outfile,"ARKStep: user_explicit = %i\n", step_mem->explicit);
  fprintf(outfile,"ARKStep: user_implicit = %i\n", step_mem->implicit);
  fprintf(outfile,"ARKStep: jcur = %i\n", step_mem->jcur);

  /* output realtype quantities */
  if (step_mem->Be != NULL) {
    fprintf(outfile,"ARKStep: explicit Butcher table:\n");
    ARKodeButcherTable_Write(step_mem->Be, outfile);
  }
  if (step_mem->Bi != NULL) {
    fprintf(outfile,"ARKStep: implicit Butcher table:\n");
    ARKodeButcherTable_Write(step_mem->Bi, outfile);
  }
  fprintf(outfile,"ARKStep: gamma = %"RSYM"\n", step_mem->gamma);
  fprintf(outfile,"ARKStep: gammap = %"RSYM"\n", step_mem->gammap);
  fprintf(outfile,"ARKStep: gamrat = %"RSYM"\n", step_mem->gamrat);
  fprintf(outfile,"ARKStep: crate = %"RSYM"\n", step_mem->crate);
  fprintf(outfile,"ARKStep: eRNrm = %"RSYM"\n", step_mem->eRNrm);
  fprintf(outfile,"ARKStep: nlscoef = %"RSYM"\n", step_mem->nlscoef);
  fprintf(outfile,"ARKStep: crdown = %"RSYM"\n", step_mem->crdown);
  fprintf(outfile,"ARKStep: rdiv = %"RSYM"\n", step_mem->rdiv);
  fprintf(outfile,"ARKStep: dgmax = %"RSYM"\n", step_mem->dgmax);

#ifdef SUNDIALS_DEBUG_PRINTVEC
  /* output vector quantities */
  fprintf(outfile, "ARKStep: sdata:\n");
  N_VPrintFile(step_mem->sdata, outfile);
  fprintf(outfile, "ARKStep: zpred:\n");
  N_VPrintFile(step_mem->zpred, outfile);
  fprintf(outfile, "ARKStep: zcor:\n");
  N_VPrintFile(step_mem->zcor, outfile);
  if (step_mem->Fe != NULL)
    for (i=0; i<step_mem->stages; i++) {
      fprintf(outfile,"ARKStep: Fe[%i]:\n", i);
      N_VPrintFile(step_mem->Fe[i], outfile);
    }
  if (step_mem->Fi != NULL)
    for (i=0; i<step_mem->stages; i++) {
      fprintf(outfile,"ARKStep: Fi[%i]:\n", i);
      N_VPrintFile(step_mem->Fi[i], outfile);
    }
#endif
}